

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

int ON_SubDFacePtr::CompareFacePointer(ON_SubDFacePtr *lhs,ON_SubDFacePtr *rhs)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (ON_SubDFacePtr *)0x0) {
    iVar1 = 1;
  }
  else {
    if (rhs != (ON_SubDFacePtr *)0x0) {
      uVar3 = lhs->m_ptr & 0xfffffffffffffff8;
      uVar4 = rhs->m_ptr & 0xfffffffffffffff8;
      uVar2 = 0xffffffff;
      if (uVar4 <= uVar3) {
        uVar2 = (uint)(uVar4 < uVar3);
      }
      return uVar2;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ON_SubDFacePtr::CompareFacePointer(
  const ON_SubDFacePtr* lhs,
  const ON_SubDFacePtr* rhs
)
{
  if (lhs == rhs)
    return 0;
  if ( nullptr == lhs )
    return 1;
  if ( nullptr == rhs )
    return -1;

  const ON__UINT_PTR lhs_ptr = (lhs->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  const ON__UINT_PTR rhs_ptr = (rhs->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  if (lhs_ptr < rhs_ptr)
    return -1;
  if (lhs_ptr > rhs_ptr)
    return 1;
  return 0;
}